

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall
chatra::RuntimeImp::initialize
          (RuntimeImp *this,uint initialThreadCount,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *savedState)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  fd_set *in_RCX;
  fd_set *__readfds;
  EVP_PKEY_CTX *src;
  fd_set *__readfds_00;
  fd_set *__readfds_01;
  fd_set *__readfds_02;
  fd_set *__readfds_03;
  fd_set *in_R8;
  timeval *in_R9;
  undefined1 local_1c8 [8];
  Reader r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [40];
  
  this->multiThread = initialThreadCount != 0xffffffff;
  registerEmbeddedClasses(&this->classes);
  registerEmbeddedFunctions(&this->methods,&this->operators);
  Reader::Reader((Reader *)local_1c8,this);
  Reader::parse((Reader *)local_1c8,300,savedState);
  std::__cxx11::string::string((string *)local_50,"sTable",(allocator *)(local_50 + 0x27));
  iVar1 = Reader::select((Reader *)local_1c8,(int)local_50,__readfds,in_RCX,in_R8,in_R9);
  StringTable::newInstance
            ((StringTable *)&r.nodeMethodTableMap._M_h._M_single_bucket,
             (Reader *)CONCAT44(extraout_var,iVar1));
  std::__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->primarySTable).
              super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2> *)
             &r.nodeMethodTableMap._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__cxx11::string::~string((string *)local_50);
  StringTable::copy((StringTable *)local_50,
                    (EVP_PKEY_CTX *)
                    (this->primarySTable).
                    super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,src);
  std::__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->distributedSTable).
              super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  launchStorage(this);
  std::__cxx11::string::string
            ((string *)local_50,"entity",(allocator *)&r.nodeMethodTableMap._M_h._M_single_bucket);
  iVar1 = Reader::select((Reader *)local_1c8,(int)local_50,__readfds_00,in_RCX,in_R8,in_R9);
  restoreEntityFrames(this,(Reader *)CONCAT44(extraout_var_00,iVar1));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string
            ((string *)local_50,"map",(allocator *)&r.nodeMethodTableMap._M_h._M_single_bucket);
  iVar1 = Reader::select((Reader *)local_1c8,(int)local_50,__readfds_01,in_RCX,in_R8,in_R9);
  restoreEntityMap(this,(Reader *)CONCAT44(extraout_var_01,iVar1));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string
            ((string *)local_50,"storage",(allocator *)&r.nodeMethodTableMap._M_h._M_single_bucket);
  iVar1 = Reader::select((Reader *)local_1c8,(int)local_50,__readfds_02,in_RCX,in_R8,in_R9);
  restoreStorage(this,(Reader *)CONCAT44(extraout_var_02,iVar1));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string
            ((string *)local_50,"state",(allocator *)&r.nodeMethodTableMap._M_h._M_single_bucket);
  iVar1 = Reader::select((Reader *)local_1c8,(int)local_50,__readfds_03,in_RCX,in_R8,in_R9);
  restoreState(this,(Reader *)CONCAT44(extraout_var_03,iVar1));
  std::__cxx11::string::~string((string *)local_50);
  reactivateFinalizerThread(this);
  launchSystem(this,initialThreadCount);
  reactivateThreads(this);
  reactivateTimers(this);
  Reader::~Reader((Reader *)local_1c8);
  return;
}

Assistant:

void RuntimeImp::initialize(unsigned initialThreadCount, const std::vector<uint8_t>& savedState) {
	multiThread = (initialThreadCount != std::numeric_limits<unsigned>::max());

	registerEmbeddedClasses(classes);
	registerEmbeddedFunctions(methods, operators);

	Reader r(*this);
	r.parse(currentVersion, savedState);

	try {
		primarySTable = StringTable::newInstance(r.select("sTable"));
		distributedSTable = primarySTable->copy();

		// Restore the world
		launchStorage();

		restoreEntityFrames(r.select("entity"));
		restoreEntityMap(r.select("map"));
		restoreStorage(r.select("storage"));
		restoreState(r.select("state"));
	}
	catch (...) {
		throw IllegalArgumentException();
	}

	chatra_assert(storage->audit());
	chatra_assert(!primarySTable->isDirty());

	reactivateFinalizerThread();

	launchSystem(initialThreadCount);
	reactivateThreads();
	reactivateTimers();
}